

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conf.cc
# Opt level: O0

int str_copy(CONF *conf,char *section,char **pto,char *from)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  BUF_MEM *str;
  size_t sVar4;
  undefined4 extraout_var;
  bool bVar5;
  BUF_MEM *buf;
  int iStack_38;
  char v;
  int len;
  int to;
  int q;
  char *from_local;
  char **pto_local;
  char *section_local;
  CONF *conf_local;
  
  iStack_38 = 0;
  str = BUF_MEM_new();
  if (str == (BUF_MEM *)0x0) {
    return 0;
  }
  sVar4 = strlen(from);
  iVar3 = BUF_MEM_grow(str,(long)((int)sVar4 + 1));
  _to = from;
  if (CONCAT44(extraout_var,iVar3) != 0) {
LAB_002f3cac:
    while (iVar3 = is_quote(*_to), iVar3 != 0) {
      cVar1 = *_to;
      pcVar2 = _to;
      while( true ) {
        _to = pcVar2 + 1;
        bVar5 = false;
        if (*_to != '\0') {
          bVar5 = *_to != cVar1;
        }
        if ((!bVar5) || ((iVar3 = is_esc(*_to), iVar3 != 0 && (_to = pcVar2 + 2, *_to == '\0'))))
        break;
        str->data[iStack_38] = *_to;
        iStack_38 = iStack_38 + 1;
        pcVar2 = _to;
      }
      if (*_to == cVar1) {
        _to = _to + 1;
      }
    }
    iVar3 = is_esc(*_to);
    if (iVar3 == 0) {
      if (*_to == '\0') goto LAB_002f3e8c;
      if (*_to == '$') goto code_r0x002f3e37;
      str->data[iStack_38] = *_to;
      _to = _to + 1;
    }
    else {
      buf._3_1_ = _to[1];
      if (buf._3_1_ == '\0') {
LAB_002f3e8c:
        str->data[iStack_38] = '\0';
        OPENSSL_free(*pto);
        *pto = str->data;
        OPENSSL_free(str);
        return 1;
      }
      if (buf._3_1_ == 'r') {
        buf._3_1_ = '\r';
      }
      else if (buf._3_1_ == 'n') {
        buf._3_1_ = '\n';
      }
      else if (buf._3_1_ == 'b') {
        buf._3_1_ = '\b';
      }
      else if (buf._3_1_ == 't') {
        buf._3_1_ = '\t';
      }
      str->data[iStack_38] = buf._3_1_;
      _to = _to + 2;
    }
    iStack_38 = iStack_38 + 1;
    goto LAB_002f3cac;
  }
LAB_002f3ec9:
  BUF_MEM_free(str);
  return 0;
code_r0x002f3e37:
  ERR_put_error(0xd,0,0x6b,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/conf/conf.cc"
                ,0xdb);
  goto LAB_002f3ec9;
}

Assistant:

static int str_copy(CONF *conf, char *section, char **pto, char *from) {
  int q, to = 0, len = 0;
  char v;
  BUF_MEM *buf;

  buf = BUF_MEM_new();
  if (buf == NULL) {
    return 0;
  }

  len = strlen(from) + 1;
  if (!BUF_MEM_grow(buf, len)) {
    goto err;
  }

  for (;;) {
    if (is_quote(*from)) {
      q = *from;
      from++;
      while (*from != '\0' && *from != q) {
        if (is_esc(*from)) {
          from++;
          if (*from == '\0') {
            break;
          }
        }
        buf->data[to++] = *(from++);
      }
      if (*from == q) {
        from++;
      }
    } else if (is_esc(*from)) {
      from++;
      v = *(from++);
      if (v == '\0') {
        break;
      } else if (v == 'r') {
        v = '\r';
      } else if (v == 'n') {
        v = '\n';
      } else if (v == 'b') {
        v = '\b';
      } else if (v == 't') {
        v = '\t';
      }
      buf->data[to++] = v;
    } else if (*from == '\0') {
      break;
    } else if (*from == '$') {
      // Historically, $foo would expand to a previously-parsed value. This
      // feature has been removed as it was unused and is a DoS vector. If
      // trying to embed '$' in a line, either escape it or wrap the value in
      // quotes.
      OPENSSL_PUT_ERROR(CONF, CONF_R_VARIABLE_EXPANSION_NOT_SUPPORTED);
      goto err;
    } else {
      buf->data[to++] = *(from++);
    }
  }

  buf->data[to] = '\0';
  OPENSSL_free(*pto);
  *pto = buf->data;
  OPENSSL_free(buf);
  return 1;

err:
  BUF_MEM_free(buf);
  return 0;
}